

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O0

void __thiscall
lsim::SimCircuit::SimCircuit(SimCircuit *this,Simulator *sim,ModelCircuit *circuit_desc)

{
  allocator local_21;
  ModelCircuit *local_20;
  ModelCircuit *circuit_desc_local;
  Simulator *sim_local;
  SimCircuit *this_local;
  
  this->m_circuit_desc = circuit_desc;
  this->m_sim = sim;
  local_20 = circuit_desc;
  circuit_desc_local = (ModelCircuit *)sim;
  sim_local = (Simulator *)this;
  std::
  unordered_map<unsigned_int,_lsim::SimComponent_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>_>
  ::unordered_map(&this->m_components);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_name,"<unnamed>",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  if (circuit_desc_local == (ModelCircuit *)0x0) {
    __assert_fail("sim",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0x11,"lsim::SimCircuit::SimCircuit(Simulator *, ModelCircuit *)");
  }
  if (local_20 != (ModelCircuit *)0x0) {
    return;
  }
  __assert_fail("circuit_desc",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x12,"lsim::SimCircuit::SimCircuit(Simulator *, ModelCircuit *)");
}

Assistant:

SimCircuit::SimCircuit(Simulator *sim, ModelCircuit *circuit_desc) :
        m_sim(sim),
        m_circuit_desc(circuit_desc),
        m_name("<unnamed>") {
    assert(sim);
    assert(circuit_desc);
}